

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O2

UStringPrepProfile * __thiscall
icu_63::LocalMemory<UStringPrepProfile>::allocateInsteadAndReset
          (LocalMemory<UStringPrepProfile> *this,int32_t newCapacity)

{
  UStringPrepProfile *__s;
  
  if (0 < newCapacity) {
    __s = (UStringPrepProfile *)uprv_malloc_63((ulong)(uint)newCapacity << 7);
    if (__s != (UStringPrepProfile *)0x0) {
      memset(__s,0,(ulong)(uint)newCapacity << 7);
      uprv_free_63((this->super_LocalPointerBase<UStringPrepProfile>).ptr);
      (this->super_LocalPointerBase<UStringPrepProfile>).ptr = __s;
      return __s;
    }
  }
  return (UStringPrepProfile *)0x0;
}

Assistant:

inline T *LocalMemory<T>::allocateInsteadAndReset(int32_t newCapacity) {
    if(newCapacity>0) {
        T *p=(T *)uprv_malloc(newCapacity*sizeof(T));
        if(p!=NULL) {
            uprv_memset(p, 0, newCapacity*sizeof(T));
            uprv_free(LocalPointerBase<T>::ptr);
            LocalPointerBase<T>::ptr=p;
        }
        return p;
    } else {
        return NULL;
    }
}